

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O0

IVec2 __thiscall
eglu::getSurfaceResolution(eglu *this,Library *egl,EGLDisplay display,EGLSurface surface)

{
  EGLint x_;
  EGLint y_;
  NotSupportedError *this_00;
  EGLint vRes;
  EGLint hRes;
  EGLSurface surface_local;
  EGLDisplay display_local;
  Library *egl_local;
  
  x_ = querySurfaceInt(egl,display,surface,0x3090);
  y_ = querySurfaceInt(egl,display,surface,0x3091);
  if ((x_ != -1) && (y_ != -1)) {
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,x_,y_);
    return (IVec2)(int  [2])this;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Surface doesn\'t support pixel density queries",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
             ,0xde);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::IVec2 getSurfaceResolution (const Library& egl, EGLDisplay display, EGLSurface surface)
{
	const EGLint hRes	= querySurfaceInt(egl, display, surface, EGL_HORIZONTAL_RESOLUTION);
	const EGLint vRes	= querySurfaceInt(egl, display, surface, EGL_VERTICAL_RESOLUTION);

	if (hRes == EGL_UNKNOWN || vRes == EGL_UNKNOWN)
		TCU_THROW(NotSupportedError, "Surface doesn't support pixel density queries");
	return tcu::IVec2(hRes, vRes);
}